

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSS.cpp
# Opt level: O0

void __thiscall NaPNStateSpace::NaPNStateSpace(NaPNStateSpace *this,char *szNodeName)

{
  NaPetriNode *in_RDI;
  char *in_stack_000003e8;
  NaPetriNode *in_stack_000003f0;
  char *in_stack_ffffffffffffffc0;
  NaPetriNode *in_stack_ffffffffffffffc8;
  NaPetriCnInput *this_00;
  NaPetriCnOutput *in_stack_ffffffffffffffe0;
  
  NaPetriNode::NaPetriNode(in_stack_000003f0,in_stack_000003e8);
  NaTimer::NaTimer((NaTimer *)(in_RDI + 1));
  in_RDI->_vptr_NaPetriNode = (_func_int **)&PTR__NaPNStateSpace_001986f0;
  in_RDI[1]._vptr_NaPetriNode = (_func_int **)&PTR_SetSamplingRate_001987e8;
  this_00 = (NaPetriCnInput *)&in_RDI[1].pcaPorts;
  NaPetriCnInput::NaPetriCnInput(this_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  NaPetriCnInput::NaPetriCnInput
            (this_00,(NaPetriNode *)&in_RDI[2].pcaPorts,in_stack_ffffffffffffffc0);
  NaPetriCnOutput::NaPetriCnOutput(in_stack_ffffffffffffffe0,in_RDI,(char *)this_00);
  NaPetriCnOutput::NaPetriCnOutput(in_stack_ffffffffffffffe0,in_RDI,(char *)this_00);
  return;
}

Assistant:

NaPNStateSpace::NaPNStateSpace (const char* szNodeName)
: NaPetriNode(szNodeName),
  ////////////////
  // Connectors //
  ////////////////
  u(this, "u"),
  x(this, "x"),
  y(this, "y"),
  time(this, "time")
{
    // Nothing to do
}